

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  Fts5SegIter *pSeg_local;
  Fts5Iter *pIter_local;
  
  (pIter->base).iRowid = pSeg->iRowid;
  (pIter->base).nData = pSeg->nPos;
  if (pSeg->pLeaf->szLeaf < pSeg->iLeafOffset + pSeg->nPos) {
    sqlite3Fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex,pSeg,(Fts5Colset *)0x0,&pIter->poslist);
    (pIter->base).pData = (pIter->poslist).p;
  }
  else {
    (pIter->base).pData = pSeg->pLeaf->p + pSeg->iLeafOffset;
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Nocolset(Fts5Iter *pIter, Fts5SegIter *pSeg){
  pIter->base.iRowid = pSeg->iRowid;
  pIter->base.nData = pSeg->nPos;

  assert( pIter->pIndex->pConfig->eDetail!=FTS5_DETAIL_NONE );
  assert( pIter->pColset==0 );

  if( pSeg->iLeafOffset+pSeg->nPos<=pSeg->pLeaf->szLeaf ){
    /* All data is stored on the current page. Populate the output 
    ** variables to point into the body of the page object. */
    pIter->base.pData = &pSeg->pLeaf->p[pSeg->iLeafOffset];
  }else{
    /* The data is distributed over two or more pages. Copy it into the
    ** Fts5Iter.poslist buffer and then set the output pointer to point
    ** to this buffer.  */
    fts5BufferZero(&pIter->poslist);
    fts5SegiterPoslist(pIter->pIndex, pSeg, 0, &pIter->poslist);
    pIter->base.pData = pIter->poslist.p;
  }
}